

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ameth.c
# Opt level: O0

int print_gost_ec_param(BIO *out,EVP_PKEY *pkey,int indent)

{
  int n;
  int iVar1;
  EC_KEY *key;
  char *pcVar2;
  int in_EDX;
  EVP_PKEY *in_RSI;
  BIO *in_RDI;
  int param_nid;
  EC_GROUP *group;
  EC_KEY *ec;
  EC_GROUP *local_40;
  int local_4;
  
  key = (EC_KEY *)EVP_PKEY_get0(in_RSI);
  if (key == (EC_KEY *)0x0) {
    local_40 = (EC_GROUP *)0x0;
  }
  else {
    local_40 = EC_KEY_get0_group(key);
  }
  if (local_40 == (EC_GROUP *)0x0) {
    local_4 = 0;
  }
  else {
    n = EC_GROUP_get_curve_name(local_40);
    iVar1 = BIO_indent(in_RDI,in_EDX,0x80);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      pcVar2 = OBJ_nid2ln(n);
      BIO_printf(in_RDI,"Parameter set: %s\n",pcVar2);
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int print_gost_ec_param(BIO *out, const EVP_PKEY *pkey, int indent)
{
    EC_KEY *ec = EVP_PKEY_get0((EVP_PKEY *)pkey);
    const EC_GROUP *group = (ec) ? EC_KEY_get0_group(ec) : NULL;
    int param_nid;

    if (!group)
        return 0;

    param_nid = EC_GROUP_get_curve_name(group);
    if (!BIO_indent(out, indent, 128))
        return 0;
    BIO_printf(out, "Parameter set: %s\n", OBJ_nid2ln(param_nid));

    return 1;
}